

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_create(secp256k1_context *ctx,secp256k1_keypair *keypair,uchar *seckey32)

{
  int iVar1;
  long in_RDX;
  void *in_RSI;
  secp256k1_ecmult_gen_context *in_RDI;
  int ret;
  secp256k1_ge pk;
  secp256k1_scalar sk;
  uint in_stack_ffffffffffffff68;
  undefined4 uVar2;
  secp256k1_callback *in_stack_ffffffffffffff70;
  int local_4;
  
  uVar2 = 0;
  if (in_RDI == (secp256k1_ecmult_gen_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/extrakeys/main_impl.h"
            ,200,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff70,(char *)(ulong)in_stack_ffffffffffffff68);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x60);
    iVar1 = secp256k1_ecmult_gen_context_is_built(in_RDI);
    if (iVar1 == 0) {
      secp256k1_callback_call
                (in_stack_ffffffffffffff70,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff68));
      local_4 = 0;
    }
    else if (in_RDX == 0) {
      secp256k1_callback_call
                (in_stack_ffffffffffffff70,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff68));
      local_4 = 0;
    }
    else {
      local_4 = secp256k1_ec_pubkey_create_helper
                          ((secp256k1_ecmult_gen_context *)pk.x.n[3],(secp256k1_scalar *)pk.x.n[2],
                           (secp256k1_ge *)pk.x.n[1],(uchar *)pk.x.n[0]);
      secp256k1_keypair_save
                ((secp256k1_keypair *)in_stack_ffffffffffffff70,
                 (secp256k1_scalar *)CONCAT44(local_4,in_stack_ffffffffffffff68),
                 (secp256k1_ge *)0x10794b);
      secp256k1_memczero(in_RSI,0x60,(uint)((local_4 != 0 ^ 0xffU) & 1));
      secp256k1_scalar_clear((secp256k1_scalar *)0x107976);
    }
  }
  return local_4;
}

Assistant:

int secp256k1_keypair_create(const secp256k1_context* ctx, secp256k1_keypair *keypair, const unsigned char *seckey32) {
    secp256k1_scalar sk;
    secp256k1_ge pk;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(keypair != NULL);
    memset(keypair, 0, sizeof(*keypair));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey32 != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &sk, &pk, seckey32);
    secp256k1_keypair_save(keypair, &sk, &pk);
    secp256k1_memczero(keypair, sizeof(*keypair), !ret);

    secp256k1_scalar_clear(&sk);
    return ret;
}